

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O0

void Saig_ManCbaUnrollCollect_rec
               (Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Int_t *vObjs,Vec_Int_t *vRoots)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Int_t *vRoots_local;
  Vec_Int_t *vObjs_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(pAig,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(pAig,pObj);
    iVar1 = Aig_ObjIsCo(pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsNode(pObj);
      if (iVar1 != 0) {
        pAVar2 = Aig_ObjFanin0(pObj);
        Saig_ManCbaUnrollCollect_rec(pAig,pAVar2,vObjs,vRoots);
        pAVar2 = Aig_ObjFanin1(pObj);
        Saig_ManCbaUnrollCollect_rec(pAig,pAVar2,vObjs,vRoots);
      }
    }
    else {
      pAVar2 = Aig_ObjFanin0(pObj);
      Saig_ManCbaUnrollCollect_rec(pAig,pAVar2,vObjs,vRoots);
    }
    if ((vRoots != (Vec_Int_t *)0x0) && (iVar1 = Saig_ObjIsLo(pAig,pObj), iVar1 != 0)) {
      pAVar2 = Saig_ObjLoToLi(pAig,pObj);
      iVar1 = Aig_ObjId(pAVar2);
      Vec_IntPush(vRoots,iVar1);
    }
    iVar1 = Aig_ObjId(pObj);
    Vec_IntPush(vObjs,iVar1);
  }
  return;
}

Assistant:

void Saig_ManCbaUnrollCollect_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Int_t * vObjs, Vec_Int_t * vRoots )
{
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsCo(pObj) )
        Saig_ManCbaUnrollCollect_rec( pAig, Aig_ObjFanin0(pObj), vObjs, vRoots );
    else if ( Aig_ObjIsNode(pObj) )
    {
        Saig_ManCbaUnrollCollect_rec( pAig, Aig_ObjFanin0(pObj), vObjs, vRoots );
        Saig_ManCbaUnrollCollect_rec( pAig, Aig_ObjFanin1(pObj), vObjs, vRoots );
    }
    if ( vRoots && Saig_ObjIsLo( pAig, pObj ) )
        Vec_IntPush( vRoots, Aig_ObjId( Saig_ObjLoToLi(pAig, pObj) ) );
    Vec_IntPush( vObjs, Aig_ObjId(pObj) );
}